

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeSorterInit(sqlite3 *db,int nField,VdbeCursor *pCsr)

{
  u32 uVar1;
  Db *pDVar2;
  char cVar3;
  VdbeSorter *pVVar4;
  u8 *puVar5;
  long lVar6;
  int iVar7;
  u32 uVar8;
  byte bVar9;
  ulong uVar10;
  KeyInfo *__dest;
  
  iVar7 = 0;
  if ((db->temp_store != '\x02') && (iVar7 = 0, sqlite3Config.bCoreMutex != 0)) {
    iVar7 = db->aLimit[0xb];
  }
  uVar10 = (ulong)pCsr->pKeyInfo->nKeyField;
  lVar6 = (long)(iVar7 * 0x68 + 200);
  pVVar4 = (VdbeSorter *)sqlite3DbMallocZero(db,uVar10 * 8 + 0x20 + lVar6);
  (pCsr->uc).pSorter = pVVar4;
  if (pVVar4 == (VdbeSorter *)0x0) {
    iVar7 = 7;
  }
  else {
    __dest = (KeyInfo *)((long)pVVar4->aTask + lVar6 + -0x60);
    pVVar4->pKeyInfo = __dest;
    memcpy(__dest,pCsr->pKeyInfo,uVar10 * 8 + 0x20);
    *(undefined8 *)((long)pVVar4->aTask + lVar6 + -0x50) = 0;
    if (iVar7 == 0 && nField != 0) {
      __dest->nKeyField = (u16)nField;
    }
    pDVar2 = db->aDb;
    uVar1 = pDVar2->pBt->pBt->pageSize;
    cVar3 = (char)iVar7;
    pVVar4->bUseThreads = 1 < (byte)(cVar3 + 1U);
    pVVar4->pgsz = uVar1;
    bVar9 = cVar3 + 1;
    pVVar4->nTask = bVar9;
    pVVar4->iPrev = cVar3 + 0xff;
    pVVar4->db = db;
    if (bVar9 != 0) {
      lVar6 = 0;
      do {
        *(VdbeSorter **)((long)&pVVar4->aTask[0].pSorter + lVar6) = pVVar4;
        lVar6 = lVar6 + 0x68;
      } while ((ulong)bVar9 * 0x68 - lVar6 != 0);
    }
    iVar7 = 0;
    if (db->temp_store != '\x02') {
      iVar7 = sqlite3Config.szPma * uVar1;
      pVVar4->mnPmaSize = iVar7;
      lVar6 = (long)pDVar2->pSchema->cache_size;
      uVar8 = 0xfffffc00;
      if (-1 < lVar6) {
        uVar8 = uVar1;
      }
      lVar6 = (int)uVar8 * lVar6;
      if (0x1fffffff < lVar6) {
        lVar6 = 0x20000000;
      }
      if (iVar7 <= (int)lVar6) {
        iVar7 = (int)lVar6;
      }
      pVVar4->mxPmaSize = iVar7;
      iVar7 = 0;
      if (sqlite3Config.bSmallMalloc == 0) {
        pVVar4->nMemory = uVar1;
        puVar5 = (u8 *)sqlite3Malloc((long)(int)uVar1);
        (pVVar4->list).aMemory = puVar5;
        iVar7 = 7;
        if (puVar5 != (u8 *)0x0) {
          iVar7 = 0;
        }
      }
    }
    if ((__dest->nAllField < 0xd) &&
       ((__dest->aColl[0] == (CollSeq *)0x0 || (__dest->aColl[0] == db->pDfltColl)))) {
      pVVar4->typeMask = '\x03';
    }
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterInit(
  sqlite3 *db,                    /* Database connection (for malloc()) */
  int nField,                     /* Number of key fields in each record */
  VdbeCursor *pCsr                /* Cursor that holds the new sorter */
){
  int pgsz;                       /* Page size of main database */
  int i;                          /* Used to iterate through aTask[] */
  VdbeSorter *pSorter;            /* The new sorter */
  KeyInfo *pKeyInfo;              /* Copy of pCsr->pKeyInfo with db==0 */
  int szKeyInfo;                  /* Size of pCsr->pKeyInfo in bytes */
  int sz;                         /* Size of pSorter in bytes */
  int rc = SQLITE_OK;
#if SQLITE_MAX_WORKER_THREADS==0
# define nWorker 0
#else
  int nWorker;
#endif

  /* Initialize the upper limit on the number of worker threads */
#if SQLITE_MAX_WORKER_THREADS>0
  if( sqlite3TempInMemory(db) || sqlite3GlobalConfig.bCoreMutex==0 ){
    nWorker = 0;
  }else{
    nWorker = db->aLimit[SQLITE_LIMIT_WORKER_THREADS];
  }
#endif

  /* Do not allow the total number of threads (main thread + all workers)
  ** to exceed the maximum merge count */
#if SQLITE_MAX_WORKER_THREADS>=SORTER_MAX_MERGE_COUNT
  if( nWorker>=SORTER_MAX_MERGE_COUNT ){
    nWorker = SORTER_MAX_MERGE_COUNT-1;
  }
#endif

  assert( pCsr->pKeyInfo && pCsr->pBtx==0 );
  assert( pCsr->eCurType==CURTYPE_SORTER );
  szKeyInfo = sizeof(KeyInfo) + (pCsr->pKeyInfo->nKeyField-1)*sizeof(CollSeq*);
  sz = sizeof(VdbeSorter) + nWorker * sizeof(SortSubtask);

  pSorter = (VdbeSorter*)sqlite3DbMallocZero(db, sz + szKeyInfo);
  pCsr->uc.pSorter = pSorter;
  if( pSorter==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }else{
    pSorter->pKeyInfo = pKeyInfo = (KeyInfo*)((u8*)pSorter + sz);
    memcpy(pKeyInfo, pCsr->pKeyInfo, szKeyInfo);
    pKeyInfo->db = 0;
    if( nField && nWorker==0 ){
      pKeyInfo->nKeyField = nField;
    }
    pSorter->pgsz = pgsz = sqlite3BtreeGetPageSize(db->aDb[0].pBt);
    pSorter->nTask = nWorker + 1;
    pSorter->iPrev = (u8)(nWorker - 1);
    pSorter->bUseThreads = (pSorter->nTask>1);
    pSorter->db = db;
    for(i=0; i<pSorter->nTask; i++){
      SortSubtask *pTask = &pSorter->aTask[i];
      pTask->pSorter = pSorter;
    }

    if( !sqlite3TempInMemory(db) ){
      i64 mxCache;                /* Cache size in bytes*/
      u32 szPma = sqlite3GlobalConfig.szPma;
      pSorter->mnPmaSize = szPma * pgsz;

      mxCache = db->aDb[0].pSchema->cache_size;
      if( mxCache<0 ){
        /* A negative cache-size value C indicates that the cache is abs(C)
        ** KiB in size.  */
        mxCache = mxCache * -1024;
      }else{
        mxCache = mxCache * pgsz;
      }
      mxCache = MIN(mxCache, SQLITE_MAX_PMASZ);
      pSorter->mxPmaSize = MAX(pSorter->mnPmaSize, (int)mxCache);

      /* Avoid large memory allocations if the application has requested
      ** SQLITE_CONFIG_SMALL_MALLOC. */
      if( sqlite3GlobalConfig.bSmallMalloc==0 ){
        assert( pSorter->iMemory==0 );
        pSorter->nMemory = pgsz;
        pSorter->list.aMemory = (u8*)sqlite3Malloc(pgsz);
        if( !pSorter->list.aMemory ) rc = SQLITE_NOMEM_BKPT;
      }
    }

    if( pKeyInfo->nAllField<13 
     && (pKeyInfo->aColl[0]==0 || pKeyInfo->aColl[0]==db->pDfltColl)
    ){
      pSorter->typeMask = SORTER_TYPE_INTEGER | SORTER_TYPE_TEXT;
    }
  }

  return rc;
}